

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::
construct_helper<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&)>
::
_construct<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(&)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&),std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&>
          (_func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr_numeric_ptr
           *val,_func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr_numeric_ptr
                *target_function)

{
  cni_holder_base *pcVar1;
  _func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr_numeric_ptr
  **in_stack_00000008;
  cni_holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
  *in_stack_00000010;
  _func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr_numeric_ptr
  *in_stack_ffffffffffffffc8;
  _func__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr_numeric_ptr
  *in_stack_ffffffffffffffd0;
  
  check_conversion<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
  ::cni_holder(in_stack_00000010,in_stack_00000008);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}